

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::FiberBase::cancel(FiberBase *this)

{
  Type TVar1;
  bool bVar2;
  FiberStack *pFVar3;
  anon_class_1_0_00000001 local_5d [13];
  Fault local_50;
  Fault f;
  Type *local_40;
  undefined1 local_38 [8];
  DebugComparison<kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)_&,_kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)>
  _kjCondition;
  FiberBase *this_local;
  
  TVar1 = this->state;
  _kjCondition._32_8_ = this;
  if (TVar1 == WAITING) {
    this->state = CANCELED;
    pFVar3 = Own<kj::_::FiberStack,_std::nullptr_t>::operator->(&this->stack);
    FiberStack::switchToFiber(pFVar3);
    local_40 = (Type *)DebugExpressionStart::operator<<
                                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,&this->state);
    f.exception._4_4_ = 3;
    DebugExpression<kj::_::FiberBase::{unnamed_type#1}&>::operator==
              ((DebugComparison<kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)_&,_kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)>
                *)local_38,(DebugExpression<kj::_::FiberBase::_unnamed_type_1_&> *)&local_40,
               (Type *)((long)&f.exception + 4));
    bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
    if (!bVar2) {
      Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::FiberBase::_unnamed_type_1_&,_unnamed_type_1_>&>
                (&local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                 ,0x65c,FAILED,"state == FINISHED","_kjCondition,",
                 (DebugComparison<kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)_&,_kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)>
                  *)local_38);
      Debug::Fault::fatal(&local_50);
    }
    pFVar3 = Own<kj::_::FiberStack,_std::nullptr_t>::operator->(&this->stack);
    FiberStack::reset(pFVar3);
  }
  else if (TVar1 - RUNNING < 2) {
    cancel::anon_class_1_0_00000001::operator()(local_5d);
  }
  else if (TVar1 == FINISHED) {
    pFVar3 = Own<kj::_::FiberStack,_std::nullptr_t>::operator->(&this->stack);
    FiberStack::reset(pFVar3);
  }
  return;
}

Assistant:

void FiberBase::cancel() {
  // Called by `~Fiber()` to begin teardown. We can't do this work in `~FiberBase()` because the
  // `Fiber` subclass contains members that may still be in-use until the fiber stops.

  switch (state) {
    case WAITING:
      // We can't just free the stack while the fiber is running. We need to force it to execute
      // until finished, so we cause it to throw an exception.
      state = CANCELED;
      stack->switchToFiber();

      // The fiber should only switch back to the main stack on completion, because any further
      // calls to wait() would throw before trying to switch.
      KJ_ASSERT(state == FINISHED);

      // The fiber shut down properly so the stack is safe to reuse.
      stack->reset();
      break;

    case RUNNING:
    case CANCELED:
      // Bad news.
      []() noexcept {
        KJ_FAIL_ASSERT("fiber tried to cancel itself");
      }();
      break;

    case FINISHED:
      // Normal completion, yay.
      stack->reset();
      break;
  }
}